

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_chrono.cpp
# Opt level: O0

int main(void)

{
  double dVar1;
  double dVar2;
  reference pvVar3;
  size_type sVar4;
  reference pvVar5;
  iterator __first;
  iterator __last;
  char *__command;
  ostream *poVar6;
  double dVar7;
  double dVar8;
  rep_conflict rVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ostream local_8f0 [8];
  ofstream timings;
  duration<long,_std::ratio<1L,_1000000000L>_> local_6f0;
  duration<double,_std::ratio<1L,_1000L>_> local_6e8;
  duration<double,_std::ratio<1L,_1000L>_> writeData;
  int local_6d4;
  undefined1 local_6d0 [4];
  int i_5;
  ostream local_6b0 [8];
  ofstream output_file;
  undefined1 local_4a8 [8];
  string mkdir_command;
  undefined1 local_480 [8];
  string output_dir;
  duration<double,_std::ratio<1L,_1000L>_> local_458;
  duration<double,_std::ratio<1L,_1000L>_> mismatch;
  int local_444;
  int i_4;
  double second;
  double first;
  int dist;
  duration<long,_std::ratio<1L,_1000000000L>_> local_420;
  duration<double,_std::ratio<1L,_1000L>_> local_418;
  duration<double,_std::ratio<1L,_1000L>_> any_of;
  int local_408;
  int i_3;
  bool any_greater_than_50;
  duration<long,_std::ratio<1L,_1000000000L>_> local_3f8;
  duration<double,_std::ratio<1L,_1000L>_> local_3f0;
  duration<double,_std::ratio<1L,_1000L>_> nth_element;
  double median;
  int half_way;
  undefined1 local_3b8 [8];
  vector<double,_std::allocator<double>_> v2;
  double skew;
  int i_2;
  double one_over_sigma3;
  double std;
  duration<double,_std::ratio<1L,_1000L>_> local_378;
  duration<double,_std::ratio<1L,_1000L>_> transform_reduce;
  double var;
  int i_1;
  duration<long,_std::ratio<1L,_1000000000L>_> local_350;
  duration<double,_std::ratio<1L,_1000L>_> local_348;
  duration<double,_std::ratio<1L,_1000L>_> reduce;
  double mean;
  double dStack_328;
  int i;
  double sum;
  allocator<double> local_311;
  istream_iterator<double,_char,_std::char_traits<char>,_long> local_310;
  istream_iterator<double,_char,_std::char_traits<char>,_long> local_2f8;
  undefined1 local_2e0 [8];
  vector<double,_std::allocator<double>_> v;
  ifstream f;
  allocator<char> local_b9;
  value_type local_b8;
  allocator<char> local_91;
  value_type local_90;
  allocator<char> local_59;
  value_type local_58;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  data_files;
  time_point t2;
  time_point t1;
  
  ::std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&t2);
  ::std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)&data_files.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_38);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"../data/0_rse_workshop.dat",&local_59);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_38,&local_58);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::allocator<char>::~allocator(&local_59);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"../data/1_rse_workshop.dat",&local_91);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_38,&local_90);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::allocator<char>::~allocator(&local_91);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"../data/2_rse_workshop.dat",&local_b9);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_38,&local_b8);
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::allocator<char>::~allocator(&local_b9);
  pvVar3 = ::std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_38,0);
  ::std::ifstream::ifstream
            (&v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(string *)pvVar3,_S_in);
  ::std::istream_iterator<double,_char,_std::char_traits<char>,_long>::istream_iterator
            (&local_2f8,
             (istream_type *)
             &v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  ::std::istream_iterator<double,_char,_std::char_traits<char>,_long>::istream_iterator(&local_310);
  ::std::allocator<double>::allocator(&local_311);
  ::std::vector<double,std::allocator<double>>::
  vector<std::istream_iterator<double,char,std::char_traits<char>,long>,void>
            ((vector<double,std::allocator<double>> *)local_2e0,&local_2f8,&local_310,&local_311);
  ::std::allocator<double>::~allocator(&local_311);
  t2.__d.__r = (duration)::std::chrono::_V2::system_clock::now();
  dStack_328 = 0.0;
  for (mean._4_4_ = 0;
      sVar4 = ::std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)local_2e0),
      (ulong)(long)mean._4_4_ < sVar4; mean._4_4_ = mean._4_4_ + 1) {
    pvVar5 = ::std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_2e0,(long)mean._4_4_);
    dStack_328 = *pvVar5 + dStack_328;
  }
  sVar4 = ::std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)local_2e0);
  auVar10._8_4_ = (int)(sVar4 >> 0x20);
  auVar10._0_8_ = sVar4;
  auVar10._12_4_ = 0x45300000;
  dVar7 = dStack_328 /
          ((auVar10._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0));
  reduce.__r = (rep_conflict)::std::chrono::_V2::system_clock::now();
  data_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)reduce.__r;
  local_350.__r =
       (rep)::std::chrono::operator-
                      ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&data_files.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,&t2);
  ::std::chrono::duration<double,std::ratio<1l,1000l>>::
  duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1000l>> *)&local_348,&local_350);
  t2.__d.__r = (duration)::std::chrono::_V2::system_clock::now();
  dStack_328 = 0.0;
  for (var._4_4_ = 0;
      sVar4 = ::std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)local_2e0),
      (ulong)(long)var._4_4_ < sVar4; var._4_4_ = var._4_4_ + 1) {
    pvVar5 = ::std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_2e0,(long)var._4_4_);
    dVar8 = *pvVar5;
    pvVar5 = ::std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_2e0,(long)var._4_4_);
    dStack_328 = dVar8 * *pvVar5 + dStack_328;
  }
  sVar4 = ::std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)local_2e0);
  auVar11._8_4_ = (int)(sVar4 >> 0x20);
  auVar11._0_8_ = sVar4;
  auVar11._12_4_ = 0x45300000;
  transform_reduce.__r = (rep_conflict)::std::chrono::_V2::system_clock::now();
  data_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)transform_reduce.__r;
  std = (double)::std::chrono::operator-
                          ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)&data_files.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,&t2);
  ::std::chrono::duration<double,std::ratio<1l,1000l>>::
  duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1000l>> *)&local_378,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)&std);
  dVar8 = sqrt(dStack_328 /
               ((auVar11._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) - dVar7 * dVar7);
  dStack_328 = 0.0;
  for (skew._4_4_ = 0;
      sVar4 = ::std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)local_2e0),
      (ulong)(long)skew._4_4_ < sVar4; skew._4_4_ = skew._4_4_ + 1) {
    pvVar5 = ::std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_2e0,(long)skew._4_4_);
    dVar1 = *pvVar5;
    pvVar5 = ::std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_2e0,(long)skew._4_4_);
    dVar2 = *pvVar5;
    pvVar5 = ::std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_2e0,(long)skew._4_4_);
    dStack_328 = (dVar1 - dVar7) * (dVar2 - dVar7) * (*pvVar5 - dVar7) *
                 (1.0 / (dVar8 * dVar8 * dVar8)) + dStack_328;
  }
  sVar4 = ::std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)local_2e0);
  auVar12._8_4_ = (int)(sVar4 >> 0x20);
  auVar12._0_8_ = sVar4;
  auVar12._12_4_ = 0x45300000;
  v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)(dStack_328 /
                ((auVar12._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)));
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_3b8,
             (vector<double,_std::allocator<double>_> *)local_2e0);
  t2.__d.__r = (duration)::std::chrono::_V2::system_clock::now();
  __first = ::std::vector<double,_std::allocator<double>_>::begin
                      ((vector<double,_std::allocator<double>_> *)local_3b8);
  __last = ::std::vector<double,_std::allocator<double>_>::end
                     ((vector<double,_std::allocator<double>_> *)local_3b8);
  ::std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             __first._M_current,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             __last._M_current);
  sVar4 = ::std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)local_3b8);
  ::std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)local_3b8,(long)(int)(sVar4 >> 1));
  nth_element.__r = (rep_conflict)::std::chrono::_V2::system_clock::now();
  data_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)nth_element.__r;
  local_3f8.__r =
       (rep)::std::chrono::operator-
                      ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&data_files.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,&t2);
  ::std::chrono::duration<double,std::ratio<1l,1000l>>::
  duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1000l>> *)&local_3f0,&local_3f8);
  t2.__d.__r = (duration)::std::chrono::_V2::system_clock::now();
  for (local_408 = 0;
      sVar4 = ::std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)local_2e0),
      (ulong)(long)local_408 < sVar4; local_408 = local_408 + 1) {
    ::std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)local_2e0,(long)local_408);
  }
  any_of.__r = (rep_conflict)::std::chrono::_V2::system_clock::now();
  data_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)any_of.__r;
  local_420.__r =
       (rep)::std::chrono::operator-
                      ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&data_files.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,&t2);
  ::std::chrono::duration<double,std::ratio<1l,1000l>>::
  duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1000l>> *)&local_418,&local_420);
  t2.__d.__r = (duration)::std::chrono::_V2::system_clock::now();
  local_444 = 0;
  do {
    sVar4 = ::std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)local_2e0);
    if (sVar4 - 1 <= (ulong)(long)local_444) {
LAB_00103dbb:
      mismatch.__r = (rep_conflict)::std::chrono::_V2::system_clock::now();
      data_files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)mismatch.__r;
      output_dir.field_2._8_8_ =
           ::std::chrono::operator-
                     ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       *)&data_files.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,&t2);
      ::std::chrono::duration<double,std::ratio<1l,1000l>>::
      duration<long,std::ratio<1l,1000000000l>,void>
                ((duration<double,std::ratio<1l,1000l>> *)&local_458,
                 (duration<long,_std::ratio<1L,_1000000000L>_> *)((long)&output_dir.field_2 + 8));
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_480,"./output",
                 (allocator<char> *)(mkdir_command.field_2._M_local_buf + 0xf));
      ::std::allocator<char>::~allocator
                ((allocator<char> *)(mkdir_command.field_2._M_local_buf + 0xf));
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4a8,"mkdir -p ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_480);
      __command = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                  ::c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_4a8);
      system(__command);
      t2.__d.__r = (duration)::std::chrono::_V2::system_clock::now();
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_6d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_480,"/results.dat");
      ::std::ofstream::ofstream(local_6b0,(string *)local_6d0,_S_out);
      ::std::__cxx11::string::~string((string *)local_6d0);
      pvVar5 = ::std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_2e0,0);
      ::std::ostream::operator<<(local_6b0,*pvVar5);
      for (local_6d4 = 1;
          sVar4 = ::std::vector<double,_std::allocator<double>_>::size
                            ((vector<double,_std::allocator<double>_> *)local_2e0),
          (ulong)(long)local_6d4 < sVar4; local_6d4 = local_6d4 + 1) {
        poVar6 = ::std::operator<<(local_6b0,',');
        pvVar5 = ::std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_2e0,(long)local_6d4);
        ::std::ostream::operator<<(poVar6,*pvVar5);
      }
      ::std::ofstream::close();
      writeData.__r = (rep_conflict)::std::chrono::_V2::system_clock::now();
      data_files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)writeData.__r;
      local_6f0.__r =
           (rep)::std::chrono::operator-
                          ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)&data_files.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,&t2);
      ::std::chrono::duration<double,std::ratio<1l,1000l>>::
      duration<long,std::ratio<1l,1000000000l>,void>
                ((duration<double,std::ratio<1l,1000l>> *)&local_6e8,&local_6f0);
      ::std::ofstream::ofstream(local_8f0,"timings_0.csv",_S_app);
      poVar6 = (ostream *)::std::ostream::operator<<(local_8f0,::std::fixed);
      rVar9 = ::std::chrono::duration<double,_std::ratio<1L,_1000L>_>::count(&local_6e8);
      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,rVar9);
      poVar6 = ::std::operator<<(poVar6,", ");
      rVar9 = ::std::chrono::duration<double,_std::ratio<1L,_1000L>_>::count(&local_348);
      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,rVar9);
      poVar6 = ::std::operator<<(poVar6,", ");
      rVar9 = ::std::chrono::duration<double,_std::ratio<1L,_1000L>_>::count(&local_378);
      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,rVar9);
      poVar6 = ::std::operator<<(poVar6,", ");
      rVar9 = ::std::chrono::duration<double,_std::ratio<1L,_1000L>_>::count(&local_3f0);
      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,rVar9);
      poVar6 = ::std::operator<<(poVar6,", ");
      rVar9 = ::std::chrono::duration<double,_std::ratio<1L,_1000L>_>::count(&local_418);
      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,rVar9);
      poVar6 = ::std::operator<<(poVar6,", ");
      rVar9 = ::std::chrono::duration<double,_std::ratio<1L,_1000L>_>::count(&local_458);
      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,rVar9);
      ::std::ostream::operator<<(poVar6,::std::endl<char,std::char_traits<char>>);
      ::std::ofstream::close();
      ::std::ofstream::~ofstream(local_8f0);
      ::std::ofstream::~ofstream(local_6b0);
      ::std::__cxx11::string::~string((string *)local_4a8);
      ::std::__cxx11::string::~string((string *)local_480);
      ::std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_3b8);
      ::std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_2e0);
      ::std::ifstream::~ifstream
                (&v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_38);
      return 0;
    }
    pvVar5 = ::std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_2e0,(long)(local_444 + 1));
    dVar7 = *pvVar5;
    pvVar5 = ::std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_2e0,(long)local_444);
    if (dVar8 * 2.0 < ABS(dVar7 - *pvVar5)) {
      ::std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)local_2e0,(long)local_444);
      ::std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)local_2e0,(long)(local_444 + 1));
      goto LAB_00103dbb;
    }
    local_444 = local_444 + 1;
  } while( true );
}

Assistant:

int main()
{
  // Declare start and end points for timings with chrono
  std::chrono::high_resolution_clock::time_point t1;
  std::chrono::high_resolution_clock::time_point t2;
  
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 1. Reading some data in from a file
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Find some pre-prepared data files
    std::vector<std::string> data_files;
    data_files.push_back("../data/0_rse_workshop.dat");
    data_files.push_back("../data/1_rse_workshop.dat");
    data_files.push_back("../data/2_rse_workshop.dat");


    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 2. Calculate the mean and standard deviation of some data
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Read some data in
    std::ifstream f(data_files[0]);
    std::vector<double> v{std::istream_iterator<double>(f), std::istream_iterator<double>()};

    // Compute mean
    t1 = std::chrono::high_resolution_clock::now();
    double sum = 0.0;
    for (int i = 0; i < v.size(); i++)
    {
        sum += v[i];
    }
    const double mean = sum / v.size();
    t2 = std::chrono::high_resolution_clock::now();
    std::chrono::duration<double, std::milli> reduce = t2 - t1;
    
    // Compute standard deviation
    t1 = std::chrono::high_resolution_clock::now();
    sum = 0.0;
    for (int i = 0; i < v.size(); i++)
    {
        sum += v[i] * v[i];
    }
    const double var = sum / v.size() - mean * mean;
    t2 = std::chrono::high_resolution_clock::now();
    std::chrono::duration<double, std::milli> transform_reduce = t2 - t1;
    
    // Compute variance
    const double std = std::sqrt(var);

    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 3. Calculate the skewness - there's no default algorithm for that!
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Compute skewness
    sum = 0.0;
    double one_over_sigma3 = 1.0 / (std * std * std);
    for (int i = 0; i < v.size(); i++)
    {
        sum += (v[i] - mean) * (v[i] - mean) * (v[i] - mean) * one_over_sigma3;
    }
    const double skew = sum / v.size();

    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 4. Calculate the median (and bonus chrono)
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    

    // Take a copy of the vector so we can sort it
    std::vector<double> v2 = v;
    t1 = std::chrono::high_resolution_clock::now();
    std::sort(v2.begin(), v2.end());
    int half_way = v2.size() / 2;
    const double median = v2[half_way];

    t2 = std::chrono::high_resolution_clock::now();
    std::chrono::duration<double, std::milli> nth_element = t2 - t1;
    
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 5. What other algorithms are there?
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Are any of the elements > 50?
    t1 = std::chrono::high_resolution_clock::now();
    bool any_greater_than_50 = false;

    for (int i = 0; i < v.size(); i++)
    {
        if (v[i] > 50.0)
        {
            any_greater_than_50 = true;
        }
    }
    t2 = std::chrono::high_resolution_clock::now();
    std::chrono::duration<double, std::milli> any_of = t2 - t1;

    // First position where consecutive elements differ by more than twice the standard deviation
    t1 = std::chrono::high_resolution_clock::now();
    int dist = 0;
    double first, second;
    for (int i = 0; i < v.size() - 1; i++)
    {
        if (std::fabs(v[i + 1] - v[i]) > 2 * std)
        {
            dist = i;
            first = v[i];
            second = v[i + 1];
            break;
        }
    }
    t2 = std::chrono::high_resolution_clock::now();
    std::chrono::duration<double, std::milli> mismatch = t2 - t1;

    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 7. Writing some data back out to a csv file - pulling several concepts together
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    std::string output_dir = "./output";
    std::string mkdir_command = "mkdir -p " + output_dir;
    // System takes a const char* as a parameter
    system(mkdir_command.c_str());

    // Create an output file
    t1 = std::chrono::high_resolution_clock::now();
    std::ofstream output_file(output_dir + "/results.dat");
    output_file << v[0];
    for (int i = 1; i < v.size(); i++)
    {
        output_file << ',' << v[i];
    }
    output_file.close();
    t2 = std::chrono::high_resolution_clock::now();
    std::chrono::duration<double, std::milli> writeData = t2 - t1;

    ////////////////////////////////////////////////////////////////////////////////

        ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// Writing timings to csv file checkpoint_xx/timings.csv
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    std::ofstream timings("timings_0.csv", std::ios::app);
    timings << std::fixed << writeData.count() << ", "
	    << reduce.count() << ", "
	    << transform_reduce.count() << ", "
	    << nth_element.count() << ", "
	    << any_of.count() << ", "
	    << mismatch.count() << std::endl;
    timings.close();
}